

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void x25519_ge_tobytes(uint8_t *s,ge_p2 *h)

{
  int iVar1;
  fe y;
  fe x;
  fe recip;
  fe local_a0;
  fe local_78;
  fe local_50;
  
  fe_invert(&local_50,&h->Z);
  fe_mul_impl(local_78.v,(fe_limb_t *)h,local_50.v);
  fe_mul_impl(local_a0.v,(h->Y).v,local_50.v);
  fe_tobytes(s,&local_a0);
  iVar1 = fe_isnegative(&local_78);
  s[0x1f] = s[0x1f] ^ (char)iVar1 << 7;
  return;
}

Assistant:

void x25519_ge_tobytes(uint8_t s[32], const ge_p2 *h) {
  fe recip;
  fe x;
  fe y;

  fe_invert(&recip, &h->Z);
  fe_mul_ttt(&x, &h->X, &recip);
  fe_mul_ttt(&y, &h->Y, &recip);
  fe_tobytes(s, &y);
  s[31] ^= fe_isnegative(&x) << 7;
}